

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

void __thiscall cfd::core::HashUtil::HashUtil(HashUtil *this,HashUtil *object)

{
  this->_vptr_HashUtil = (_func_int **)&PTR__HashUtil_00740618;
  ByteData::ByteData(&this->buffer_);
  this->hash_type_ = object->hash_type_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_,
             &(object->buffer_).data_);
  return;
}

Assistant:

HashUtil::HashUtil(const HashUtil &object) {
  hash_type_ = object.hash_type_;
  buffer_ = object.buffer_;
}